

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::AggregateInitialiserList::~AggregateInitialiserList(AggregateInitialiserList *this)

{
  ~AggregateInitialiserList(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}